

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer.cc
# Opt level: O2

void wabt::WriteDebugName(Stream *stream,string_view name,char *desc)

{
  const_reference pcVar1;
  char *pcVar2;
  PrintChars in_R9D;
  string_view s;
  string_view local_28;
  
  local_28.size_ = name.size_;
  local_28.data_ = name.data_;
  if ((char *)local_28.size_ == (char *)0x0) {
    pcVar2 = (char *)0x0;
  }
  else {
    pcVar1 = string_view::front(&local_28);
    if (*pcVar1 != '$') {
      __assert_fail("stripped_name.front() == \'$\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/binary-writer.cc"
                    ,0x4b,"void wabt::WriteDebugName(Stream *, string_view, const char *)");
    }
    string_view::remove_prefix(&local_28,1);
    pcVar2 = (char *)local_28.size_;
  }
  s.size_ = (size_type)desc;
  s.data_ = pcVar2;
  WriteStr((wabt *)stream,(Stream *)local_28.data_,s,(char *)0x1,in_R9D);
  return;
}

Assistant:

void WriteDebugName(Stream* stream, string_view name, const char* desc) {
  string_view stripped_name = name;
  if (!stripped_name.empty()) {
    // Strip leading $ from name
    assert(stripped_name.front() == '$');
    stripped_name.remove_prefix(1);
  }
  WriteStr(stream, stripped_name, desc, PrintChars::Yes);
}